

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O2

void cm_print_error(char *format,...)

{
  undefined8 *puVar1;
  long lVar2;
  char *__s;
  char in_AL;
  uint uVar3;
  size_t sVar4;
  void *pvVar5;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  long *in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 auStack_528 [8];
  undefined8 local_520;
  undefined8 local_518;
  undefined8 local_510;
  undefined8 local_508;
  undefined8 local_500;
  undefined4 local_4f8;
  undefined8 local_4e8;
  undefined8 local_4d8;
  undefined8 local_4c8;
  undefined8 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  va_list args;
  undefined8 local_458;
  undefined1 *puStack_450;
  undefined1 *local_448;
  char buffer [1024];
  
  args[0].reg_save_area = auStack_528;
  if (in_AL != '\0') {
    local_4f8 = in_XMM0_Da;
    local_4e8 = in_XMM1_Qa;
    local_4d8 = in_XMM2_Qa;
    local_4c8 = in_XMM3_Qa;
    local_4b8 = in_XMM4_Qa;
    local_4a8 = in_XMM5_Qa;
    local_498 = in_XMM6_Qa;
    local_488 = in_XMM7_Qa;
  }
  lVar2 = in_FS_OFFSET[5];
  args[0].overflow_arg_area = &stack0x00000008;
  args[0].gp_offset = 8;
  args[0].fp_offset = 0x30;
  local_520 = in_RSI;
  local_518 = in_RDX;
  local_510 = in_RCX;
  local_508 = in_R8;
  local_500 = in_R9;
  if (cm_error_message_enabled == '\0') {
    local_458 = 0x3000000008;
    puStack_450 = (undefined1 *)args[0].overflow_arg_area;
    local_448 = auStack_528;
    uVar3 = vsnprintf(buffer,0x400,format,args);
    if (-1 < (int)uVar3) {
      puVar1 = (undefined8 *)(*in_FS_OFFSET + -0x110);
      __s = (char *)*puVar1;
      if (__s == (char *)0x0) {
        pvVar5 = calloc(1,(ulong)(uVar3 + 1));
        *puVar1 = pvVar5;
        if (pvVar5 == (void *)0x0) goto LAB_0012779e;
        sVar4 = 0;
      }
      else {
        sVar4 = strlen(__s);
        pvVar5 = realloc(__s,uVar3 + sVar4 + 1);
        if (pvVar5 == (void *)0x0) goto LAB_0012779e;
        *puVar1 = pvVar5;
      }
      if (uVar3 < 0x400) {
        memcpy((char *)((long)pvVar5 + sVar4),buffer,(ulong)(uVar3 + 1));
      }
      else {
        vsnprintf((char *)((long)pvVar5 + sVar4),(ulong)uVar3,format,&local_458);
      }
    }
  }
  else {
    args[0].reg_save_area = auStack_528;
    vprint_error(format,args);
  }
LAB_0012779e:
  if (in_FS_OFFSET[5] == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void cm_print_error(const char * const format, ...)
{
    va_list args;
    va_start(args, format);
    if (cm_error_message_enabled) {
        vcm_print_error(format, args);
    } else {
        vprint_error(format, args);
    }
    va_end(args);
}